

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSynchronizationOperation.cpp
# Opt level: O0

SyncInfo __thiscall
vkt::synchronization::anon_unknown_0::ClearAttachments::Implementation::getSyncInfo
          (Implementation *this)

{
  VkImageAspectFlags VVar1;
  SyncInfo SVar2;
  ImageResource *pIVar3;
  Implementation *this_local;
  undefined4 uStack_10;
  SyncInfo syncInfo;
  
  pIVar3 = Resource::getImage(this->m_resource);
  VVar1 = (pIVar3->subresourceRange).aspectMask;
  if (VVar1 == 1) {
    uStack_10 = 0x100;
    syncInfo.stageMask = 2;
  }
  else if ((VVar1 == 2) || (VVar1 == 4)) {
    uStack_10 = 0x400;
    syncInfo.stageMask = 3;
  }
  SVar2.accessMask = uStack_10;
  SVar2.stageMask = 0x10000;
  SVar2.imageLayout = syncInfo.stageMask;
  return SVar2;
}

Assistant:

SyncInfo getSyncInfo (void) const
	{
		SyncInfo syncInfo;
		syncInfo.stageMask = VK_PIPELINE_STAGE_ALL_COMMANDS_BIT;

		switch (m_resource.getImage().subresourceRange.aspectMask)
		{
			case VK_IMAGE_ASPECT_COLOR_BIT:
				syncInfo.accessMask		= VK_ACCESS_COLOR_ATTACHMENT_WRITE_BIT;
				syncInfo.imageLayout	= VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL;
			break;
			case VK_IMAGE_ASPECT_STENCIL_BIT:
			case VK_IMAGE_ASPECT_DEPTH_BIT:
				syncInfo.accessMask		= VK_ACCESS_DEPTH_STENCIL_ATTACHMENT_WRITE_BIT;
				syncInfo.imageLayout	= VK_IMAGE_LAYOUT_DEPTH_STENCIL_ATTACHMENT_OPTIMAL;
			break;
			default:
				DE_ASSERT(0);
			break;
		}

		return syncInfo;
	}